

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

void __thiscall
gflags::anon_unknown_2::CommandLineFlag::FillCommandLineFlagInfo
          (CommandLineFlag *this,CommandLineFlagInfo *result)

{
  string sStack_38;
  
  std::__cxx11::string::assign((char *)result);
  type_name(this);
  std::__cxx11::string::assign((char *)&result->type);
  std::__cxx11::string::assign((char *)&result->description);
  (anonymous_namespace)::CommandLineFlag::current_value_abi_cxx11_(&sStack_38,this);
  std::__cxx11::string::operator=((string *)&result->current_value,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  (anonymous_namespace)::FlagValue::ToString_abi_cxx11_(&sStack_38,this->defvalue_);
  std::__cxx11::string::operator=((string *)&result->default_value,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  std::__cxx11::string::assign((char *)&result->filename);
  UpdateModifiedBit(this);
  result->is_default = (bool)(this->modified_ ^ 1);
  result->has_validator_fn = this->validate_fn_proto_ != (ValidateFnProto)0x0;
  result->flag_ptr = this->current_->value_buffer_;
  return;
}

Assistant:

void CommandLineFlag::FillCommandLineFlagInfo(
    CommandLineFlagInfo* result) {
  result->name = name();
  result->type = type_name();
  result->description = help();
  result->current_value = current_value();
  result->default_value = default_value();
  result->filename = CleanFileName();
  UpdateModifiedBit();
  result->is_default = !modified_;
  result->has_validator_fn = validate_function() != NULL;
  result->flag_ptr = flag_ptr();
}